

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::SamplerUniform::SamplerUniform(SamplerUniform *this)

{
  SamplerUniform *this_local;
  
  UniformInfo::UniformInfo(&this->super_UniformInfo);
  (this->super_UniformInfo)._vptr_UniformInfo = (_func_int **)&PTR__SamplerUniform_016664c0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::SharedPtr(&this->image);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
            (&this->imageView);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)20>_>_>::SharedPtr(&this->sampler)
  ;
  de::SharedPtr<vk::Allocation>::SharedPtr(&this->alloc);
  ::vk::VkDescriptorImageInfo::VkDescriptorImageInfo(&this->descriptor);
  return;
}

Assistant:

virtual						~SamplerUniform	(void) {}